

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Attribute_PDU::Encode(Attribute_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pAVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Attribute_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,&(this->m_OrigSimAddr).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32Padding);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ExtPDUType);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ExtProtocolVersion);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32MasterRecType);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ActionCode);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8Padding1);
  KDataStream::operator<<(pKVar2,this->m_ui16NumAttrRecSets);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
            ::begin(&this->m_vAttributeRecordSets);
  local_28._M_current =
       (AttributeRecordSet *)
       std::
       vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
       ::end(&this->m_vAttributeRecordSets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pAVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pAVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pAVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Attribute_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_OrigSimAddr
           << m_ui32Padding
           << m_ui16Padding
           << m_ui8ExtPDUType
           << m_ui8ExtProtocolVersion
           << m_ui32MasterRecType
           << m_ui8ActionCode
           << m_ui8Padding1
           << m_ui16NumAttrRecSets;

    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }		
}